

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

bool __thiscall BaseIndex::Commit(BaseIndex *this)

{
  Chain *chain;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  _Vector_base<uint256,_std::allocator<uint256>_> _Stack_b8;
  CDBBatch batch;
  uint256 local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_best_block_index)._M_b._M_p != (__pointer_type)0x0) {
    iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
    CDBBatch::CDBBatch(&batch,(CDBWrapper *)CONCAT44(extraout_var,iVar3));
    iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xd])(this,&batch);
    if ((char)iVar3 == '\0') {
      CDBBatch::~CDBBatch(&batch);
    }
    else {
      (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      chain = (this->m_chain)._M_t.
              super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
              .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
              super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
      CBlockIndex::GetBlockHash(&local_48,(this->m_best_block_index)._M_b._M_p);
      GetLocator((CBlockLocator *)&_Stack_b8,chain,&local_48);
      CDBBatch::Write<unsigned_char,CBlockLocator>(&batch,"B9BaseIndex",(CBlockLocator *)&_Stack_b8)
      ;
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&_Stack_b8);
      iVar3 = (*(this->super_CValidationInterface)._vptr_CValidationInterface[0xf])(this);
      bVar1 = CDBWrapper::WriteBatch((CDBWrapper *)CONCAT44(extraout_var_00,iVar3),&batch,false);
      CDBBatch::~CDBBatch(&batch);
      bVar2 = true;
      if (bVar1) goto LAB_006d90e5;
    }
  }
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
  ;
  source_file._M_len = 0x5e;
  logging_function._M_str = "Commit";
  logging_function._M_len = 6;
  LogPrintFormatInternal<char[7],std::__cxx11::string>
            (logging_function,source_file,0xf1,ALL,Error,(ConstevalFormatString<2U>)0xc8f080,
             (char (*) [7])0xe3cf88,&this->m_name);
  bVar2 = false;
LAB_006d90e5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool BaseIndex::Commit()
{
    // Don't commit anything if we haven't indexed any block yet
    // (this could happen if init is interrupted).
    bool ok = m_best_block_index != nullptr;
    if (ok) {
        CDBBatch batch(GetDB());
        ok = CustomCommit(batch);
        if (ok) {
            GetDB().WriteBestBlock(batch, GetLocator(*m_chain, m_best_block_index.load()->GetBlockHash()));
            ok = GetDB().WriteBatch(batch);
        }
    }
    if (!ok) {
        LogError("%s: Failed to commit latest %s state\n", __func__, GetName());
        return false;
    }
    return true;
}